

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scene.cpp
# Opt level: O3

Scene * __thiscall CGL::GLScene::Scene::get_static_scene(Scene *this)

{
  pointer ppSVar1;
  pointer ppSVar2;
  int iVar3;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  Scene *this_00;
  vector<CGL::GLScene::SceneObject_*,_std::allocator<CGL::GLScene::SceneObject_*>_> *__range2;
  pointer ppSVar4;
  pointer ppSVar5;
  vector<CGL::SceneObjects::SceneLight_*,_std::allocator<CGL::SceneObjects::SceneLight_*>_>
  staticLights;
  vector<CGL::SceneObjects::SceneObject_*,_std::allocator<CGL::SceneObjects::SceneObject_*>_>
  staticObjects;
  SceneLight *local_70;
  vector<CGL::SceneObjects::SceneLight_*,_std::allocator<CGL::SceneObjects::SceneLight_*>_> local_68
  ;
  vector<CGL::SceneObjects::SceneObject_*,_std::allocator<CGL::SceneObjects::SceneObject_*>_>
  local_48;
  
  local_48.
  super__Vector_base<CGL::SceneObjects::SceneObject_*,_std::allocator<CGL::SceneObjects::SceneObject_*>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_48.
  super__Vector_base<CGL::SceneObjects::SceneObject_*,_std::allocator<CGL::SceneObjects::SceneObject_*>_>
  ._M_impl.super__Vector_impl_data._M_finish = (SceneObject **)0x0;
  local_48.
  super__Vector_base<CGL::SceneObjects::SceneObject_*,_std::allocator<CGL::SceneObjects::SceneObject_*>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (SceneObject **)0x0;
  local_68.
  super__Vector_base<CGL::SceneObjects::SceneLight_*,_std::allocator<CGL::SceneObjects::SceneLight_*>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (SceneLight **)0x0;
  local_68.
  super__Vector_base<CGL::SceneObjects::SceneLight_*,_std::allocator<CGL::SceneObjects::SceneLight_*>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_68.
  super__Vector_base<CGL::SceneObjects::SceneLight_*,_std::allocator<CGL::SceneObjects::SceneLight_*>_>
  ._M_impl.super__Vector_impl_data._M_finish = (SceneLight **)0x0;
  ppSVar4 = (this->objects).
            super__Vector_base<CGL::GLScene::SceneObject_*,_std::allocator<CGL::GLScene::SceneObject_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  ppSVar1 = (this->objects).
            super__Vector_base<CGL::GLScene::SceneObject_*,_std::allocator<CGL::GLScene::SceneObject_*>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  if (ppSVar4 != ppSVar1) {
    do {
      iVar3 = (*(*ppSVar4)->_vptr_SceneObject[0xc])();
      local_70 = (SceneLight *)CONCAT44(extraout_var,iVar3);
      if (local_48.
          super__Vector_base<CGL::SceneObjects::SceneObject_*,_std::allocator<CGL::SceneObjects::SceneObject_*>_>
          ._M_impl.super__Vector_impl_data._M_finish ==
          local_48.
          super__Vector_base<CGL::SceneObjects::SceneObject_*,_std::allocator<CGL::SceneObjects::SceneObject_*>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::vector<CGL::SceneObjects::SceneObject*,std::allocator<CGL::SceneObjects::SceneObject*>>
        ::_M_realloc_insert<CGL::SceneObjects::SceneObject*>
                  ((vector<CGL::SceneObjects::SceneObject*,std::allocator<CGL::SceneObjects::SceneObject*>>
                    *)&local_48,
                   (iterator)
                   local_48.
                   super__Vector_base<CGL::SceneObjects::SceneObject_*,_std::allocator<CGL::SceneObjects::SceneObject_*>_>
                   ._M_impl.super__Vector_impl_data._M_finish,(SceneObject **)&local_70);
      }
      else {
        *local_48.
         super__Vector_base<CGL::SceneObjects::SceneObject_*,_std::allocator<CGL::SceneObjects::SceneObject_*>_>
         ._M_impl.super__Vector_impl_data._M_finish = (SceneObject *)local_70;
        local_48.
        super__Vector_base<CGL::SceneObjects::SceneObject_*,_std::allocator<CGL::SceneObjects::SceneObject_*>_>
        ._M_impl.super__Vector_impl_data._M_finish =
             local_48.
             super__Vector_base<CGL::SceneObjects::SceneObject_*,_std::allocator<CGL::SceneObjects::SceneObject_*>_>
             ._M_impl.super__Vector_impl_data._M_finish + 1;
      }
      ppSVar4 = ppSVar4 + 1;
    } while (ppSVar4 != ppSVar1);
  }
  ppSVar5 = (this->lights).
            super__Vector_base<CGL::GLScene::SceneLight_*,_std::allocator<CGL::GLScene::SceneLight_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  ppSVar2 = (this->lights).
            super__Vector_base<CGL::GLScene::SceneLight_*,_std::allocator<CGL::GLScene::SceneLight_*>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  if (ppSVar5 != ppSVar2) {
    do {
      iVar3 = (**(*ppSVar5)->_vptr_SceneLight)();
      local_70 = (SceneLight *)CONCAT44(extraout_var_00,iVar3);
      if (local_68.
          super__Vector_base<CGL::SceneObjects::SceneLight_*,_std::allocator<CGL::SceneObjects::SceneLight_*>_>
          ._M_impl.super__Vector_impl_data._M_finish ==
          local_68.
          super__Vector_base<CGL::SceneObjects::SceneLight_*,_std::allocator<CGL::SceneObjects::SceneLight_*>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::vector<CGL::SceneObjects::SceneLight*,std::allocator<CGL::SceneObjects::SceneLight*>>::
        _M_realloc_insert<CGL::SceneObjects::SceneLight*>
                  ((vector<CGL::SceneObjects::SceneLight*,std::allocator<CGL::SceneObjects::SceneLight*>>
                    *)&local_68,
                   (iterator)
                   local_68.
                   super__Vector_base<CGL::SceneObjects::SceneLight_*,_std::allocator<CGL::SceneObjects::SceneLight_*>_>
                   ._M_impl.super__Vector_impl_data._M_finish,&local_70);
      }
      else {
        *local_68.
         super__Vector_base<CGL::SceneObjects::SceneLight_*,_std::allocator<CGL::SceneObjects::SceneLight_*>_>
         ._M_impl.super__Vector_impl_data._M_finish = local_70;
        local_68.
        super__Vector_base<CGL::SceneObjects::SceneLight_*,_std::allocator<CGL::SceneObjects::SceneLight_*>_>
        ._M_impl.super__Vector_impl_data._M_finish =
             local_68.
             super__Vector_base<CGL::SceneObjects::SceneLight_*,_std::allocator<CGL::SceneObjects::SceneLight_*>_>
             ._M_impl.super__Vector_impl_data._M_finish + 1;
      }
      ppSVar5 = ppSVar5 + 1;
    } while (ppSVar5 != ppSVar2);
  }
  this_00 = (Scene *)operator_new(0x30);
  SceneObjects::Scene::Scene(this_00,&local_48,&local_68);
  if (local_68.
      super__Vector_base<CGL::SceneObjects::SceneLight_*,_std::allocator<CGL::SceneObjects::SceneLight_*>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_68.
                    super__Vector_base<CGL::SceneObjects::SceneLight_*,_std::allocator<CGL::SceneObjects::SceneLight_*>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_48.
      super__Vector_base<CGL::SceneObjects::SceneObject_*,_std::allocator<CGL::SceneObjects::SceneObject_*>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_48.
                    super__Vector_base<CGL::SceneObjects::SceneObject_*,_std::allocator<CGL::SceneObjects::SceneObject_*>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  }
  return this_00;
}

Assistant:

SceneObjects::Scene *Scene::get_static_scene() {
  std::vector<SceneObjects::SceneObject *> staticObjects;
  std::vector<SceneObjects::SceneLight *> staticLights;

  for (SceneObject *obj : objects) {
    staticObjects.push_back(obj->get_static_object());
  }
  for (SceneLight *light : lights) {
    staticLights.push_back(light->get_static_light());
  }

  return new SceneObjects::Scene(staticObjects, staticLights);
}